

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

void __thiscall leveldb::Status::Status(Status *this,Code code,Slice *msg,Slice *msg2)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  
  if (code != kOk) {
    uVar1 = msg2->size_;
    iVar2 = (int)uVar1;
    iVar4 = iVar2 + 2;
    if (iVar2 == 0) {
      iVar4 = 0;
    }
    uVar6 = msg->size_;
    iVar3 = (int)uVar6;
    piVar5 = (int *)operator_new__((ulong)(iVar4 + iVar3 + 5));
    *piVar5 = iVar4 + iVar3;
    *(char *)(piVar5 + 1) = (char)code;
    uVar6 = uVar6 & 0xffffffff;
    memcpy((char *)((long)piVar5 + 5),msg->data_,uVar6);
    if (iVar2 != 0) {
      *(char *)((long)piVar5 + (ulong)(iVar3 + 5)) = ':';
      *(char *)((long)piVar5 + (ulong)(iVar3 + 6)) = ' ';
      memcpy((char *)((long)piVar5 + uVar6 + 7),msg2->data_,uVar1 & 0xffffffff);
    }
    this->state_ = (char *)piVar5;
    return;
  }
  __assert_fail("code != kOk",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/status.cc"
                ,0x16,"leveldb::Status::Status(Code, const Slice &, const Slice &)");
}

Assistant:

Status::Status(Code code, const Slice& msg, const Slice& msg2) {
  assert(code != kOk);
  const uint32_t len1 = static_cast<uint32_t>(msg.size());
  const uint32_t len2 = static_cast<uint32_t>(msg2.size());
  const uint32_t size = len1 + (len2 ? (2 + len2) : 0);
  char* result = new char[size + 5];
  std::memcpy(result, &size, sizeof(size));
  result[4] = static_cast<char>(code);
  std::memcpy(result + 5, msg.data(), len1);
  if (len2) {
    result[5 + len1] = ':';
    result[6 + len1] = ' ';
    std::memcpy(result + 7 + len1, msg2.data(), len2);
  }
  state_ = result;
}